

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.h
# Opt level: O1

RayDifferential * __thiscall
pbrt::Interaction::SpawnRay(RayDifferential *__return_storage_ptr__,Interaction *this,Vector3f *d)

{
  Float FVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  uintptr_t uVar5;
  undefined1 auVar6 [16];
  MediumHandle *pMVar7;
  undefined1 in_ZMM0 [64];
  undefined1 auVar9 [56];
  undefined1 auVar8 [64];
  undefined1 auVar10 [16];
  Point3f PVar11;
  
  auVar9 = in_ZMM0._8_56_;
  PVar11 = OffsetRayOrigin(this,d);
  auVar8._0_8_ = PVar11.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar8._8_56_ = auVar9;
  FVar1 = this->time;
  if (this->mediumInterface == (MediumInterface *)0x0) {
    pMVar7 = &this->medium;
  }
  else {
    fVar2 = (this->n).super_Tuple3<pbrt::Normal3,_float>.z;
    fVar3 = (d->super_Tuple3<pbrt::Vector3,_float>).z;
    auVar10 = ZEXT416((uint)(fVar2 * fVar3));
    auVar6 = vfmadd132ss_fma(ZEXT416((uint)(this->n).super_Tuple3<pbrt::Normal3,_float>.y),auVar10,
                             ZEXT416((uint)(d->super_Tuple3<pbrt::Vector3,_float>).y));
    auVar10 = vfmsub213ss_fma(ZEXT416((uint)fVar3),ZEXT416((uint)fVar2),auVar10);
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ + auVar10._0_4_)),
                             ZEXT416((uint)(this->n).super_Tuple3<pbrt::Normal3,_float>.x),
                             ZEXT416((uint)(d->super_Tuple3<pbrt::Vector3,_float>).x));
    pMVar7 = &this->mediumInterface->inside + (0.0 < auVar6._0_4_);
  }
  uVar5 = (pMVar7->
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          ).bits;
  uVar4 = vmovlps_avx(auVar8._0_16_);
  (__return_storage_ptr__->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar4;
  (__return_storage_ptr__->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar4 >> 0x20);
  (__return_storage_ptr__->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
       PVar11.super_Tuple3<pbrt::Point3,_float>.z;
  fVar2 = (d->super_Tuple3<pbrt::Vector3,_float>).y;
  (__return_storage_ptr__->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x =
       (d->super_Tuple3<pbrt::Vector3,_float>).x;
  (__return_storage_ptr__->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y = fVar2;
  (__return_storage_ptr__->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
       (d->super_Tuple3<pbrt::Vector3,_float>).z;
  (__return_storage_ptr__->super_Ray).time = FVar1;
  (__return_storage_ptr__->super_Ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = uVar5;
  __return_storage_ptr__->hasDifferentials = false;
  (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z = 0;
  (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z = 0;
  (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  return __return_storage_ptr__;
}

Assistant:

SpawnRay(const Vector3f &d) const {
        return RayDifferential(OffsetRayOrigin(d), d, time, GetMedium(d));
    }